

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QuickSort.h
# Opt level: O3

void JsUtil::
     QuickSort<Memory::_no_write_barrier_policy,_char,_int_(*)(void_*,_const_void_*,_const_void_*)>
     ::Sort(char *base,size_t nmemb,size_t size,_func_int_void_ptr_void_ptr_void_ptr *comparer,
           void *context)

{
  char *pcVar1;
  char *b;
  char cVar2;
  undefined2 uVar3;
  undefined4 uVar4;
  undefined8 uVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  char *pcVar13;
  ulong uVar14;
  ulong uVar15;
  char *pcVar16;
  char *pcVar17;
  uint uVar18;
  ulong uVar19;
  ulong uVar20;
  char *pcVar21;
  char *pcVar22;
  char *pcVar23;
  size_t local_40;
  
  if (base == (char *)0x0) {
    return;
  }
  uVar18 = (uint)size;
  uVar7 = (ulong)(uVar18 & 1);
  uVar8 = (ulong)(uVar18 & 3);
  uVar9 = (ulong)(uVar18 & 7);
  uVar19 = size >> 3;
  while (9 < nmemb) {
    uVar15 = (nmemb >> 2) * size;
    pcVar16 = base + uVar15;
    iVar6 = (*comparer)(context,pcVar16,base);
    if ((uVar15 != 0) && (iVar6 < 0)) {
      if (size < 8) {
        if (size < 4) {
          uVar14 = uVar7;
          if (1 < size) {
            uVar3 = *(undefined2 *)base;
            *(undefined2 *)base = *(undefined2 *)pcVar16;
            *(undefined2 *)pcVar16 = uVar3;
          }
        }
        else {
          uVar4 = *(undefined4 *)base;
          *(undefined4 *)base = *(undefined4 *)pcVar16;
          *(undefined4 *)pcVar16 = uVar4;
          uVar14 = uVar8;
        }
      }
      else {
        uVar10 = 0;
        do {
          uVar5 = *(undefined8 *)(base + uVar10 * 8);
          *(undefined8 *)(base + uVar10 * 8) = *(undefined8 *)(pcVar16 + uVar10 * 8);
          *(undefined8 *)(pcVar16 + uVar10 * 8) = uVar5;
          uVar10 = uVar10 + 1;
          uVar14 = uVar9;
        } while (uVar19 != uVar10);
      }
      if (uVar14 != 0) {
        uVar10 = 0;
        do {
          cVar2 = base[uVar10];
          base[uVar10] = pcVar16[uVar10];
          pcVar16[uVar10] = cVar2;
          uVar10 = uVar10 + 1;
        } while (uVar14 != uVar10);
      }
    }
    uVar14 = (nmemb - 1) * size;
    pcVar23 = base + uVar14;
    uVar10 = (nmemb * 3 >> 2) * size;
    pcVar1 = base + uVar10;
    iVar6 = (*comparer)(context,pcVar23,pcVar1);
    if ((uVar10 - uVar14 != 0) && (iVar6 < 0)) {
      if (size < 8) {
        if (size < 4) {
          uVar20 = uVar7;
          if (1 < size) {
            uVar3 = *(undefined2 *)pcVar1;
            *(undefined2 *)pcVar1 = *(undefined2 *)pcVar23;
            *(undefined2 *)pcVar23 = uVar3;
          }
        }
        else {
          uVar4 = *(undefined4 *)pcVar1;
          *(undefined4 *)pcVar1 = *(undefined4 *)pcVar23;
          *(undefined4 *)pcVar23 = uVar4;
          uVar20 = uVar8;
        }
      }
      else {
        uVar11 = 0;
        do {
          uVar5 = *(undefined8 *)(pcVar1 + uVar11 * 8);
          *(undefined8 *)(pcVar1 + uVar11 * 8) = *(undefined8 *)(pcVar23 + uVar11 * 8);
          *(undefined8 *)(pcVar23 + uVar11 * 8) = uVar5;
          uVar11 = uVar11 + 1;
          uVar20 = uVar9;
        } while (uVar19 != uVar11);
      }
      if (uVar20 != 0) {
        uVar11 = 0;
        do {
          cVar2 = pcVar1[uVar11];
          pcVar1[uVar11] = pcVar23[uVar11];
          pcVar23[uVar11] = cVar2;
          uVar11 = uVar11 + 1;
        } while (uVar20 != uVar11);
      }
    }
    uVar20 = (nmemb >> 1) * size;
    pcVar13 = base + uVar20;
    iVar6 = (*comparer)(context,pcVar23,pcVar13);
    if ((uVar20 - uVar14 != 0) && (iVar6 < 0)) {
      if (size < 8) {
        if (size < 4) {
          uVar11 = uVar7;
          if (1 < size) {
            uVar3 = *(undefined2 *)pcVar13;
            *(undefined2 *)pcVar13 = *(undefined2 *)pcVar23;
            *(undefined2 *)pcVar23 = uVar3;
          }
        }
        else {
          uVar4 = *(undefined4 *)pcVar13;
          *(undefined4 *)pcVar13 = *(undefined4 *)pcVar23;
          *(undefined4 *)pcVar23 = uVar4;
          uVar11 = uVar8;
        }
      }
      else {
        uVar12 = 0;
        do {
          uVar5 = *(undefined8 *)(pcVar13 + uVar12 * 8);
          *(undefined8 *)(pcVar13 + uVar12 * 8) = *(undefined8 *)(pcVar23 + uVar12 * 8);
          *(undefined8 *)(pcVar23 + uVar12 * 8) = uVar5;
          uVar12 = uVar12 + 1;
          uVar11 = uVar9;
        } while (uVar19 != uVar12);
      }
      if (uVar11 != 0) {
        uVar12 = 0;
        do {
          cVar2 = pcVar13[uVar12];
          pcVar13[uVar12] = pcVar23[uVar12];
          pcVar23[uVar12] = cVar2;
          uVar12 = uVar12 + 1;
        } while (uVar11 != uVar12);
      }
    }
    iVar6 = (*comparer)(context,pcVar1,pcVar13);
    if ((uVar20 != uVar10) && (iVar6 < 0)) {
      if (size < 8) {
        if (size < 4) {
          uVar11 = uVar7;
          if (1 < size) {
            uVar3 = *(undefined2 *)pcVar13;
            *(undefined2 *)pcVar13 = *(undefined2 *)pcVar1;
            *(undefined2 *)pcVar1 = uVar3;
          }
        }
        else {
          uVar4 = *(undefined4 *)pcVar13;
          *(undefined4 *)pcVar13 = *(undefined4 *)pcVar1;
          *(undefined4 *)pcVar1 = uVar4;
          uVar11 = uVar8;
        }
      }
      else {
        uVar12 = 0;
        do {
          uVar5 = *(undefined8 *)(pcVar13 + uVar12 * 8);
          *(undefined8 *)(pcVar13 + uVar12 * 8) = *(undefined8 *)(pcVar1 + uVar12 * 8);
          *(undefined8 *)(pcVar1 + uVar12 * 8) = uVar5;
          uVar12 = uVar12 + 1;
          uVar11 = uVar9;
        } while (uVar19 != uVar12);
      }
      if (uVar11 != 0) {
        uVar12 = 0;
        do {
          cVar2 = pcVar13[uVar12];
          pcVar13[uVar12] = pcVar1[uVar12];
          pcVar1[uVar12] = cVar2;
          uVar12 = uVar12 + 1;
        } while (uVar11 != uVar12);
      }
    }
    iVar6 = (*comparer)(context,pcVar1,base);
    if ((uVar10 != 0) && (iVar6 < 0)) {
      if (size < 8) {
        if (size < 4) {
          uVar11 = uVar7;
          if (1 < size) {
            uVar3 = *(undefined2 *)base;
            *(undefined2 *)base = *(undefined2 *)pcVar1;
            *(undefined2 *)pcVar1 = uVar3;
          }
        }
        else {
          uVar4 = *(undefined4 *)base;
          *(undefined4 *)base = *(undefined4 *)pcVar1;
          *(undefined4 *)pcVar1 = uVar4;
          uVar11 = uVar8;
        }
      }
      else {
        uVar12 = 0;
        do {
          uVar5 = *(undefined8 *)(base + uVar12 * 8);
          *(undefined8 *)(base + uVar12 * 8) = *(undefined8 *)(pcVar1 + uVar12 * 8);
          *(undefined8 *)(pcVar1 + uVar12 * 8) = uVar5;
          uVar12 = uVar12 + 1;
          uVar11 = uVar9;
        } while (uVar19 != uVar12);
      }
      if (uVar11 != 0) {
        uVar12 = 0;
        do {
          cVar2 = base[uVar12];
          base[uVar12] = pcVar1[uVar12];
          pcVar1[uVar12] = cVar2;
          uVar12 = uVar12 + 1;
        } while (uVar11 != uVar12);
      }
    }
    iVar6 = (*comparer)(context,pcVar13,base);
    if ((uVar20 != 0) && (iVar6 < 0)) {
      if (size < 8) {
        if (size < 4) {
          uVar11 = uVar7;
          if (1 < size) {
            uVar3 = *(undefined2 *)base;
            *(undefined2 *)base = *(undefined2 *)pcVar13;
            *(undefined2 *)pcVar13 = uVar3;
          }
        }
        else {
          uVar4 = *(undefined4 *)base;
          *(undefined4 *)base = *(undefined4 *)pcVar13;
          *(undefined4 *)pcVar13 = uVar4;
          uVar11 = uVar8;
        }
      }
      else {
        uVar12 = 0;
        do {
          uVar5 = *(undefined8 *)(base + uVar12 * 8);
          *(undefined8 *)(base + uVar12 * 8) = *(undefined8 *)(pcVar13 + uVar12 * 8);
          *(undefined8 *)(pcVar13 + uVar12 * 8) = uVar5;
          uVar12 = uVar12 + 1;
          uVar11 = uVar9;
        } while (uVar19 != uVar12);
      }
      if (uVar11 != 0) {
        uVar12 = 0;
        do {
          cVar2 = base[uVar12];
          base[uVar12] = pcVar13[uVar12];
          pcVar13[uVar12] = cVar2;
          uVar12 = uVar12 + 1;
        } while (uVar11 != uVar12);
      }
    }
    iVar6 = (*comparer)(context,pcVar23,pcVar16);
    if ((uVar15 != uVar14) && (iVar6 < 0)) {
      if (size < 8) {
        if (size < 4) {
          uVar11 = uVar7;
          if (1 < size) {
            uVar3 = *(undefined2 *)pcVar16;
            *(undefined2 *)pcVar16 = *(undefined2 *)pcVar23;
            *(undefined2 *)pcVar23 = uVar3;
          }
        }
        else {
          uVar4 = *(undefined4 *)pcVar16;
          *(undefined4 *)pcVar16 = *(undefined4 *)pcVar23;
          *(undefined4 *)pcVar23 = uVar4;
          uVar11 = uVar8;
        }
      }
      else {
        uVar12 = 0;
        do {
          uVar5 = *(undefined8 *)(pcVar16 + uVar12 * 8);
          *(undefined8 *)(pcVar16 + uVar12 * 8) = *(undefined8 *)(pcVar23 + uVar12 * 8);
          *(undefined8 *)(pcVar23 + uVar12 * 8) = uVar5;
          uVar12 = uVar12 + 1;
          uVar11 = uVar9;
        } while (uVar19 != uVar12);
      }
      if (uVar11 != 0) {
        uVar12 = 0;
        do {
          cVar2 = pcVar16[uVar12];
          pcVar16[uVar12] = pcVar23[uVar12];
          pcVar23[uVar12] = cVar2;
          uVar12 = uVar12 + 1;
        } while (uVar11 != uVar12);
      }
    }
    iVar6 = (*comparer)(context,pcVar1,pcVar16);
    if ((uVar15 != uVar10) && (iVar6 < 0)) {
      if (size < 8) {
        if (size < 4) {
          uVar10 = uVar7;
          if (1 < size) {
            uVar3 = *(undefined2 *)pcVar16;
            *(undefined2 *)pcVar16 = *(undefined2 *)pcVar1;
            *(undefined2 *)pcVar1 = uVar3;
          }
        }
        else {
          uVar4 = *(undefined4 *)pcVar16;
          *(undefined4 *)pcVar16 = *(undefined4 *)pcVar1;
          *(undefined4 *)pcVar1 = uVar4;
          uVar10 = uVar8;
        }
      }
      else {
        uVar11 = 0;
        do {
          uVar5 = *(undefined8 *)(pcVar16 + uVar11 * 8);
          *(undefined8 *)(pcVar16 + uVar11 * 8) = *(undefined8 *)(pcVar1 + uVar11 * 8);
          *(undefined8 *)(pcVar1 + uVar11 * 8) = uVar5;
          uVar11 = uVar11 + 1;
          uVar10 = uVar9;
        } while (uVar19 != uVar11);
      }
      if (uVar10 != 0) {
        uVar11 = 0;
        do {
          cVar2 = pcVar16[uVar11];
          pcVar16[uVar11] = pcVar1[uVar11];
          pcVar1[uVar11] = cVar2;
          uVar11 = uVar11 + 1;
        } while (uVar10 != uVar11);
      }
    }
    iVar6 = (*comparer)(context,pcVar13,pcVar16);
    if ((uVar15 != uVar20) && (iVar6 < 0)) {
      if (size < 8) {
        if (size < 4) {
          uVar15 = uVar7;
          if (1 < size) {
            uVar3 = *(undefined2 *)pcVar16;
            *(undefined2 *)pcVar16 = *(undefined2 *)pcVar13;
            *(undefined2 *)pcVar13 = uVar3;
          }
        }
        else {
          uVar4 = *(undefined4 *)pcVar16;
          *(undefined4 *)pcVar16 = *(undefined4 *)pcVar13;
          *(undefined4 *)pcVar13 = uVar4;
          uVar15 = uVar8;
        }
      }
      else {
        uVar10 = 0;
        do {
          uVar5 = *(undefined8 *)(pcVar16 + uVar10 * 8);
          *(undefined8 *)(pcVar16 + uVar10 * 8) = *(undefined8 *)(pcVar13 + uVar10 * 8);
          *(undefined8 *)(pcVar13 + uVar10 * 8) = uVar5;
          uVar10 = uVar10 + 1;
          uVar15 = uVar9;
        } while (uVar19 != uVar10);
      }
      if (uVar15 != 0) {
        uVar10 = 0;
        do {
          cVar2 = pcVar16[uVar10];
          pcVar16[uVar10] = pcVar13[uVar10];
          pcVar13[uVar10] = cVar2;
          uVar10 = uVar10 + 1;
        } while (uVar15 != uVar10);
      }
    }
    if (uVar20 != uVar14) {
      if (size < 8) {
        if (size < 4) {
          uVar15 = uVar7;
          if (1 < size) {
            uVar3 = *(undefined2 *)pcVar23;
            *(undefined2 *)pcVar23 = *(undefined2 *)pcVar13;
            *(undefined2 *)pcVar13 = uVar3;
          }
        }
        else {
          uVar4 = *(undefined4 *)pcVar23;
          *(undefined4 *)pcVar23 = *(undefined4 *)pcVar13;
          *(undefined4 *)pcVar13 = uVar4;
          uVar15 = uVar8;
        }
      }
      else {
        uVar10 = 0;
        do {
          uVar5 = *(undefined8 *)(pcVar23 + uVar10 * 8);
          *(undefined8 *)(pcVar23 + uVar10 * 8) = *(undefined8 *)(pcVar13 + uVar10 * 8);
          *(undefined8 *)(pcVar13 + uVar10 * 8) = uVar5;
          uVar10 = uVar10 + 1;
          uVar15 = uVar9;
        } while (uVar19 != uVar10);
      }
      if (uVar15 != 0) {
        uVar10 = 0;
        do {
          cVar2 = pcVar23[uVar10];
          pcVar23[uVar10] = pcVar13[uVar10];
          pcVar13[uVar10] = cVar2;
          uVar10 = uVar10 + 1;
        } while (uVar15 != uVar10);
      }
    }
    if (uVar20 == 0) {
      local_40 = 0;
      uVar15 = 0;
    }
    else {
      uVar15 = 0;
      local_40 = 0;
      pcVar16 = base;
      do {
        pcVar1 = base + uVar15;
        iVar6 = (*comparer)(context,pcVar1,pcVar23);
        if (iVar6 < 1) {
          if (uVar15 != local_40 * size) {
            pcVar13 = base + local_40 * size;
            if (size < 8) {
              if (size < 4) {
                uVar10 = uVar7;
                if (1 < size) {
                  uVar3 = *(undefined2 *)pcVar1;
                  *(undefined2 *)pcVar1 = *(undefined2 *)pcVar13;
                  *(undefined2 *)pcVar13 = uVar3;
                }
              }
              else {
                uVar4 = *(undefined4 *)pcVar1;
                *(undefined4 *)pcVar1 = *(undefined4 *)pcVar13;
                *(undefined4 *)pcVar13 = uVar4;
                uVar10 = uVar8;
              }
            }
            else {
              uVar11 = 0;
              do {
                uVar5 = *(undefined8 *)(pcVar16 + uVar11 * 8);
                *(undefined8 *)(pcVar16 + uVar11 * 8) = *(undefined8 *)(pcVar13 + uVar11 * 8);
                *(undefined8 *)(pcVar13 + uVar11 * 8) = uVar5;
                uVar11 = uVar11 + 1;
                uVar10 = uVar9;
              } while (uVar19 != uVar11);
            }
            if (uVar10 != 0) {
              uVar11 = 0;
              do {
                cVar2 = pcVar16[uVar11];
                pcVar16[uVar11] = pcVar13[uVar11];
                pcVar13[uVar11] = cVar2;
                uVar11 = uVar11 + 1;
              } while (uVar10 != uVar11);
            }
          }
          local_40 = local_40 + 1;
        }
        uVar15 = uVar15 + size;
        pcVar16 = pcVar16 + size;
      } while (uVar15 < uVar20);
    }
    if (uVar15 < uVar14) {
      pcVar16 = base + uVar15;
      do {
        pcVar1 = base + uVar15;
        iVar6 = (*comparer)(context,pcVar1,pcVar23);
        if (iVar6 < 0) {
          if (uVar15 != local_40 * size) {
            pcVar13 = base + local_40 * size;
            if (size < 8) {
              if (size < 4) {
                uVar10 = uVar7;
                if (1 < size) {
                  uVar3 = *(undefined2 *)pcVar1;
                  *(undefined2 *)pcVar1 = *(undefined2 *)pcVar13;
                  *(undefined2 *)pcVar13 = uVar3;
                }
              }
              else {
                uVar4 = *(undefined4 *)pcVar1;
                *(undefined4 *)pcVar1 = *(undefined4 *)pcVar13;
                *(undefined4 *)pcVar13 = uVar4;
                uVar10 = uVar8;
              }
            }
            else {
              uVar20 = 0;
              do {
                uVar5 = *(undefined8 *)(pcVar16 + uVar20 * 8);
                *(undefined8 *)(pcVar16 + uVar20 * 8) = *(undefined8 *)(pcVar13 + uVar20 * 8);
                *(undefined8 *)(pcVar13 + uVar20 * 8) = uVar5;
                uVar20 = uVar20 + 1;
                uVar10 = uVar9;
              } while (uVar19 != uVar20);
            }
            if (uVar10 != 0) {
              uVar20 = 0;
              do {
                cVar2 = pcVar16[uVar20];
                pcVar16[uVar20] = pcVar13[uVar20];
                pcVar13[uVar20] = cVar2;
                uVar20 = uVar20 + 1;
              } while (uVar10 != uVar20);
            }
          }
          local_40 = local_40 + 1;
        }
        uVar15 = uVar15 + size;
        pcVar16 = pcVar16 + size;
      } while (uVar15 < uVar14);
    }
    if (local_40 * size - uVar14 != 0) {
      pcVar16 = base + local_40 * size;
      if (size < 8) {
        if (size < 4) {
          uVar15 = uVar7;
          if (1 < size) {
            uVar3 = *(undefined2 *)pcVar16;
            *(undefined2 *)pcVar16 = *(undefined2 *)pcVar23;
            *(undefined2 *)pcVar23 = uVar3;
          }
        }
        else {
          uVar4 = *(undefined4 *)pcVar16;
          *(undefined4 *)pcVar16 = *(undefined4 *)pcVar23;
          *(undefined4 *)pcVar23 = uVar4;
          uVar15 = uVar8;
        }
      }
      else {
        uVar14 = 0;
        do {
          uVar5 = *(undefined8 *)(pcVar16 + uVar14 * 8);
          *(undefined8 *)(pcVar16 + uVar14 * 8) = *(undefined8 *)(pcVar23 + uVar14 * 8);
          *(undefined8 *)(pcVar23 + uVar14 * 8) = uVar5;
          uVar14 = uVar14 + 1;
          uVar15 = uVar9;
        } while (uVar19 != uVar14);
      }
      if (uVar15 != 0) {
        uVar14 = 0;
        do {
          cVar2 = pcVar16[uVar14];
          pcVar16[uVar14] = pcVar23[uVar14];
          pcVar23[uVar14] = cVar2;
          uVar14 = uVar14 + 1;
        } while (uVar15 != uVar14);
      }
    }
    Sort(base,local_40,size,comparer,context);
    nmemb = nmemb - (local_40 + 1);
    base = base + (local_40 + 1) * size;
    if (base == (char *)0x0) {
      return;
    }
  }
  switch(nmemb) {
  case 2:
    pcVar13 = base + size;
    iVar6 = (*comparer)(context,pcVar13,base);
    break;
  case 3:
    pcVar13 = base + size;
    iVar6 = (*comparer)(context,pcVar13,base);
    if (iVar6 < 0) {
      QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(base,pcVar13,size);
    }
    iVar6 = (*comparer)(context,base + size * 2,pcVar13);
    if (iVar6 < 0) {
      QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar13,base + size * 2,size);
    }
    iVar6 = (*comparer)(context,pcVar13,base);
    break;
  case 4:
    pcVar16 = base + size;
    iVar6 = (*comparer)(context,pcVar16,base);
    if (iVar6 < 0) {
      QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(base,pcVar16,size);
    }
    pcVar23 = base + size * 3;
    pcVar13 = base + size * 2;
    iVar6 = (*comparer)(context,pcVar23,pcVar13);
    if (iVar6 < 0) {
      QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar13,pcVar23,size);
    }
    iVar6 = (*comparer)(context,pcVar13,base);
    if (iVar6 < 0) {
      QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(base,pcVar13,size);
    }
    iVar6 = (*comparer)(context,pcVar23,pcVar16);
    if (iVar6 < 0) {
      QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar16,pcVar23,size);
    }
    iVar6 = (*comparer)(context,pcVar13,pcVar16);
    base = pcVar16;
    break;
  case 5:
    pcVar16 = base + size;
    iVar6 = (*comparer)(context,pcVar16,base);
    if (iVar6 < 0) {
      QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(base,pcVar16,size);
    }
    pcVar23 = base + size * 4;
    pcVar17 = base + size * 3;
    iVar6 = (*comparer)(context,pcVar23,pcVar17);
    if (iVar6 < 0) {
      QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar17,pcVar23,size);
    }
    pcVar13 = base + size * 2;
    iVar6 = (*comparer)(context,pcVar23,pcVar13);
    if (iVar6 < 0) {
      QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar13,pcVar23,size);
    }
    iVar6 = (*comparer)(context,pcVar17,pcVar13);
    if (iVar6 < 0) {
      QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar13,pcVar17,size);
    }
    iVar6 = (*comparer)(context,pcVar17,base);
    if (iVar6 < 0) {
      QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(base,pcVar17,size);
    }
    iVar6 = (*comparer)(context,pcVar13,base);
    if (iVar6 < 0) {
      QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(base,pcVar13,size);
    }
    iVar6 = (*comparer)(context,pcVar23,pcVar16);
    if (iVar6 < 0) {
      QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar16,pcVar23,size);
    }
    iVar6 = (*comparer)(context,pcVar17,pcVar16);
    goto joined_r0x003ae8b7;
  case 6:
    pcVar16 = base + size * 2;
    pcVar23 = base + size;
    iVar6 = (*comparer)(context,pcVar16,pcVar23);
    if (iVar6 < 0) {
      QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar23,pcVar16,size);
    }
    iVar6 = (*comparer)(context,pcVar16,base);
    if (iVar6 < 0) {
      QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(base,pcVar16,size);
    }
    iVar6 = (*comparer)(context,pcVar23,base);
    if (iVar6 < 0) {
      QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(base,pcVar23,size);
    }
    pcVar13 = base + size * 5;
    pcVar1 = base + size * 4;
    iVar6 = (*comparer)(context,pcVar13,pcVar1);
    if (iVar6 < 0) {
      QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar1,pcVar13,size);
    }
    pcVar17 = base + size * 3;
    iVar6 = (*comparer)(context,pcVar13,pcVar17);
    if (iVar6 < 0) {
      QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar17,pcVar13,size);
    }
    iVar6 = (*comparer)(context,pcVar1,pcVar17);
    if (iVar6 < 0) {
      QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar17,pcVar1,size);
    }
    iVar6 = (*comparer)(context,pcVar17,base);
    if (iVar6 < 0) {
      QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(base,pcVar17,size);
    }
    iVar6 = (*comparer)(context,pcVar1,pcVar23);
    if (iVar6 < 0) {
      QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar23,pcVar1,size);
    }
    iVar6 = (*comparer)(context,pcVar13,pcVar16);
    if (iVar6 < 0) {
      QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar16,pcVar13,size);
    }
    iVar6 = (*comparer)(context,pcVar1,pcVar16);
    if (iVar6 < 0) {
      QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar16,pcVar1,size);
    }
    iVar6 = (*comparer)(context,pcVar17,pcVar23);
    pcVar13 = pcVar17;
joined_r0x003ae8b7:
    if (iVar6 < 0) {
      QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(base + size,pcVar17,size);
    }
    iVar6 = (*comparer)(context,pcVar13,pcVar16);
    base = pcVar16;
    break;
  case 7:
    pcVar16 = base + size * 2;
    pcVar23 = base + size;
    iVar6 = (*comparer)(context,pcVar16,pcVar23);
    if (iVar6 < 0) {
      QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar23,pcVar16,size);
    }
    iVar6 = (*comparer)(context,pcVar16,base);
    if (iVar6 < 0) {
      QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(base,pcVar16,size);
    }
    iVar6 = (*comparer)(context,pcVar23,base);
    if (iVar6 < 0) {
      QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(base,pcVar23,size);
    }
    pcVar1 = base + size * 4;
    pcVar13 = base + size * 3;
    iVar6 = (*comparer)(context,pcVar1,pcVar13);
    if (iVar6 < 0) {
      QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar13,pcVar1,size);
    }
    pcVar17 = base + size * 6;
    pcVar22 = base + size * 5;
    iVar6 = (*comparer)(context,pcVar17,pcVar22);
    if (iVar6 < 0) {
      QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar22,pcVar17,size);
    }
    iVar6 = (*comparer)(context,pcVar22,pcVar13);
    if (iVar6 < 0) {
      QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar13,pcVar22,size);
    }
    iVar6 = (*comparer)(context,pcVar17,pcVar1);
    if (iVar6 < 0) {
      QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar1,pcVar17,size);
    }
    iVar6 = (*comparer)(context,pcVar22,pcVar1);
    if (iVar6 < 0) {
      QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar1,pcVar22,size);
    }
    iVar6 = (*comparer)(context,pcVar1,base);
    if (iVar6 < 0) {
      QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(base,pcVar1,size);
    }
    iVar6 = (*comparer)(context,pcVar13,base);
    if (iVar6 < 0) {
      QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(base,pcVar13,size);
    }
    iVar6 = (*comparer)(context,pcVar22,pcVar23);
    if (iVar6 < 0) {
      QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar23,pcVar22,size);
    }
    iVar6 = (*comparer)(context,pcVar17,pcVar16);
    if (iVar6 < 0) {
      QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar16,pcVar17,size);
    }
    iVar6 = (*comparer)(context,pcVar22,pcVar16);
    if (iVar6 < 0) {
      QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar16,pcVar22,size);
    }
    iVar6 = (*comparer)(context,pcVar13,pcVar23);
    if (iVar6 < 0) {
      QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar23,pcVar13,size);
    }
    iVar6 = (*comparer)(context,pcVar1,pcVar16);
    if (iVar6 < 0) {
      QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar16,pcVar1,size);
    }
    iVar6 = (*comparer)(context,pcVar13,pcVar16);
    base = pcVar16;
    break;
  case 8:
    pcVar16 = base + size;
    iVar6 = (*comparer)(context,pcVar16,base);
    if (iVar6 < 0) {
      QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(base,pcVar16,size);
    }
    pcVar23 = base + size * 3;
    pcVar1 = base + size * 2;
    iVar6 = (*comparer)(context,pcVar23,pcVar1);
    if (iVar6 < 0) {
      QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar1,pcVar23,size);
    }
    iVar6 = (*comparer)(context,pcVar1,base);
    if (iVar6 < 0) {
      QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(base,pcVar1,size);
    }
    iVar6 = (*comparer)(context,pcVar23,pcVar16);
    if (iVar6 < 0) {
      QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar16,pcVar23,size);
    }
    iVar6 = (*comparer)(context,pcVar1,pcVar16);
    if (iVar6 < 0) {
      QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar16,pcVar1,size);
    }
    pcVar17 = base + size * 5;
    pcVar13 = base + size * 4;
    iVar6 = (*comparer)(context,pcVar17,pcVar13);
    if (iVar6 < 0) {
      QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar13,pcVar17,size);
    }
    pcVar21 = base + size * 7;
    pcVar22 = base + size * 6;
    iVar6 = (*comparer)(context,pcVar21,pcVar22);
    if (iVar6 < 0) {
      QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar22,pcVar21,size);
    }
    iVar6 = (*comparer)(context,pcVar22,pcVar13);
    if (iVar6 < 0) {
      QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar13,pcVar22,size);
    }
    iVar6 = (*comparer)(context,pcVar21,pcVar17);
    if (iVar6 < 0) {
      QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar17,pcVar21,size);
    }
    iVar6 = (*comparer)(context,pcVar22,pcVar17);
    if (iVar6 < 0) {
      QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar17,pcVar22,size);
    }
    iVar6 = (*comparer)(context,pcVar13,base);
    if (iVar6 < 0) {
      QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(base,pcVar13,size);
    }
    iVar6 = (*comparer)(context,pcVar17,pcVar16);
    if (iVar6 < 0) {
      QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar16,pcVar17,size);
    }
    iVar6 = (*comparer)(context,pcVar13,pcVar16);
    if (iVar6 < 0) {
      QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar16,pcVar13,size);
    }
    iVar6 = (*comparer)(context,pcVar22,pcVar1);
    if (iVar6 < 0) {
      QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar1,pcVar22,size);
    }
    iVar6 = (*comparer)(context,pcVar21,pcVar23);
    if (iVar6 < 0) {
      QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar23,pcVar21,size);
    }
    iVar6 = (*comparer)(context,pcVar22,pcVar23);
    if (iVar6 < 0) {
      QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar23,pcVar22,size);
    }
    iVar6 = (*comparer)(context,pcVar13,pcVar1);
    if (iVar6 < 0) {
      QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar1,pcVar13,size);
    }
    iVar6 = (*comparer)(context,pcVar17,pcVar23);
    if (iVar6 < 0) {
      QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar23,pcVar17,size);
    }
    iVar6 = (*comparer)(context,pcVar13,pcVar23);
    base = pcVar23;
    break;
  case 9:
    pcVar16 = base + size;
    iVar6 = (*comparer)(context,pcVar16,base);
    if (iVar6 < 0) {
      QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(base,pcVar16,size);
    }
    pcVar23 = base + size * 4;
    pcVar1 = base + size * 3;
    iVar6 = (*comparer)(context,pcVar23,pcVar1);
    if (iVar6 < 0) {
      QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar1,pcVar23,size);
    }
    pcVar17 = base + size * 7;
    pcVar13 = base + size * 6;
    iVar6 = (*comparer)(context,pcVar17,pcVar13);
    if (iVar6 < 0) {
      QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar13,pcVar17,size);
    }
    pcVar22 = base + size * 2;
    iVar6 = (*comparer)(context,pcVar22,pcVar16);
    if (iVar6 < 0) {
      QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar16,pcVar22,size);
    }
    pcVar21 = base + size * 5;
    iVar6 = (*comparer)(context,pcVar21,pcVar23);
    if (iVar6 < 0) {
      QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar23,pcVar21,size);
    }
    b = base + size * 8;
    iVar6 = (*comparer)(context,b,pcVar17);
    if (iVar6 < 0) {
      QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar17,b,size);
    }
    iVar6 = (*comparer)(context,pcVar16,base);
    if (iVar6 < 0) {
      QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(base,pcVar16,size);
    }
    iVar6 = (*comparer)(context,pcVar23,pcVar1);
    if (iVar6 < 0) {
      QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar1,pcVar23,size);
    }
    iVar6 = (*comparer)(context,pcVar17,pcVar13);
    if (iVar6 < 0) {
      QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar13,pcVar17,size);
    }
    iVar6 = (*comparer)(context,pcVar1,base);
    if (iVar6 < 0) {
      QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(base,pcVar1,size);
    }
    iVar6 = (*comparer)(context,pcVar13,pcVar1);
    if (iVar6 < 0) {
      QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar1,pcVar13,size);
    }
    iVar6 = (*comparer)(context,pcVar1,base);
    if (iVar6 < 0) {
      QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(base,pcVar1,size);
    }
    iVar6 = (*comparer)(context,pcVar23,pcVar16);
    if (iVar6 < 0) {
      QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar16,pcVar23,size);
    }
    iVar6 = (*comparer)(context,pcVar17,pcVar23);
    if (iVar6 < 0) {
      QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar23,pcVar17,size);
    }
    iVar6 = (*comparer)(context,pcVar23,pcVar16);
    if (iVar6 < 0) {
      QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar16,pcVar23,size);
    }
    iVar6 = (*comparer)(context,pcVar21,pcVar22);
    if (iVar6 < 0) {
      QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar22,pcVar21,size);
    }
    iVar6 = (*comparer)(context,b,pcVar21);
    if (iVar6 < 0) {
      QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar21,b,size);
    }
    iVar6 = (*comparer)(context,pcVar21,pcVar22);
    if (iVar6 < 0) {
      QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar22,pcVar21,size);
    }
    iVar6 = (*comparer)(context,pcVar1,pcVar16);
    if (iVar6 < 0) {
      QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar16,pcVar1,size);
    }
    iVar6 = (*comparer)(context,pcVar17,pcVar21);
    if (iVar6 < 0) {
      QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar21,pcVar17,size);
    }
    iVar6 = (*comparer)(context,pcVar13,pcVar22);
    if (iVar6 < 0) {
      QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar22,pcVar13,size);
    }
    iVar6 = (*comparer)(context,pcVar13,pcVar23);
    if (iVar6 < 0) {
      QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar23,pcVar13,size);
    }
    iVar6 = (*comparer)(context,pcVar23,pcVar22);
    if (iVar6 < 0) {
      QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar22,pcVar23,size);
    }
    iVar6 = (*comparer)(context,pcVar1,pcVar22);
    if (iVar6 < 0) {
      QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar22,pcVar1,size);
    }
    iVar6 = (*comparer)(context,pcVar13,pcVar21);
    base = pcVar21;
    break;
  default:
    return;
  }
  if (-1 < iVar6) {
    return;
  }
  QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(base,pcVar13,size);
  return;
}

Assistant:

static void Sort(T* base, size_t nmemb, size_t size, Comparer comparer, void* context)
        {
            if (!base)
            {
                return;
            }

            if (nmemb <= 9) // use sorting networks for members <= 2^3
            {
                switch(nmemb)
                {
                    case 9:
                        CCQ_SORT9()
                        break;
                    case 8:
                        CCQ_SORT8()
                        break;
                    case 7:
                        CCQ_SORT7()
                        break;
                    case 6:
                        CCQ_SORT6()
                        break;
                    case 5:
                        CCQ_SORT5(0, 1, 2, 3, 4)
                        break;
                    case 4:
                        CCQ_SORT4()
                        break;
                    case 3:
                        CCQ_SORT3()
                        break;
                    case 2:
                        CCQ_SORT2(0, 1)
                        break;
                    default:
                        break; // nothing to sort
                }

                return;
            }

            CCQ_SORT5(0, (nmemb / 4), (nmemb / 2), ((3 * nmemb) / 4), (nmemb - 1));
            // guess the median is in the middle now.
            size_t pos = 0;
            const size_t pivot = (nmemb - 1) * size;
            // make last element the median(pivot)
            CCQ_SWAP(base + pivot, base + ((nmemb / 2) * size), size);

            // standard qsort pt. below
            size_t i = 0;
            for (; i < nmemb / 2 * size; i+= size)
            {
                // During the first half, count equal values as below the pivot
                if (comparer(context, base + i, base + pivot) <= 0)
                {
                    CCQ_SWAP(base + i, base + (pos * size), size);
                    pos++;
                }
            }

            for (; i < pivot; i+= size)
            {
                // During the second half, count equal values as above the pivot
                if (comparer(context, base + i, base + pivot) < 0)
                {
                    CCQ_SWAP(base + i, base + (pos * size), size);
                    pos++;
                }
            }

            // issue the last change
            CCQ_SWAP(base + (pos * size), base + pivot, size);

            Sort(base, pos++, size, comparer, context);
            Sort(base + (pos * size), nmemb - pos, size, comparer, context);
        }